

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::JunitReporter::~JunitReporter(JunitReporter *this)

{
  (this->super_SharedImpl<Catch::IReporter>).super_IReporter.super_IShared.super_NonCopyable.
  _vptr_NonCopyable = (_func_int **)&PTR__JunitReporter_0016d380;
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&this->m_stdErr);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&this->m_stdOut);
  std::
  _Vector_base<const_Catch::JunitReporter::TestCaseStats_*,_std::allocator<const_Catch::JunitReporter::TestCaseStats_*>_>
  ::~_Vector_base(&(this->m_currentTestCaseStats).
                   super__Vector_base<const_Catch::JunitReporter::TestCaseStats_*,_std::allocator<const_Catch::JunitReporter::TestCaseStats_*>_>
                 );
  std::vector<Catch::JunitReporter::Stats,_std::allocator<Catch::JunitReporter::Stats>_>::~vector
            (&this->m_statsForSuites);
  Stats::~Stats(&this->m_testSuiteStats);
  Ptr<Catch::IConfig>::~Ptr(&(this->m_config).m_fullConfig);
  IReporter::~IReporter((IReporter *)this);
  return;
}

Assistant:

JunitReporter::~JunitReporter() {}